

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O0

bool __thiscall iutest::StdioFile::OpenImpl(StdioFile *this,char *filename,int mode)

{
  FILE *pFVar1;
  int mode_local;
  char *filename_local;
  StdioFile *this_local;
  
  (*(this->super_IFile).super_IOutStream._vptr_IOutStream[4])();
  if (mode == 1) {
    pFVar1 = internal::posix::FileOpen(filename,"rb");
    this->m_fp = pFVar1;
  }
  else if (mode == 2) {
    pFVar1 = internal::posix::FileOpen(filename,"wb");
    this->m_fp = pFVar1;
  }
  else if (mode == 3) {
    pFVar1 = internal::posix::FileOpen(filename,"ab");
    this->m_fp = pFVar1;
  }
  return this->m_fp != (FILE *)0x0;
}

Assistant:

virtual bool OpenImpl(const char* filename, int mode) IUTEST_CXX_OVERRIDE
    {
        Close();
        switch( mode )
        {
        case IFile::OpenRead:
            m_fp = internal::posix::FileOpen(filename, "rb");
            break;
        case IFile::OpenWrite:
            m_fp = internal::posix::FileOpen(filename, "wb");
            break;
        case IFile::OpenAppend:
            m_fp = internal::posix::FileOpen(filename, "ab");
            break;
        default:
            break;
        }
        return m_fp != NULL;
    }